

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbf_tests.cpp
# Opt level: O3

void __thiscall rbf_tests::feerate_chunks_utilities::test_method(feerate_chunks_utilities *this)

{
  partial_ordering pVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  initializer_list<FeeFrac> __l;
  initializer_list<FeeFrac> __l_00;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  Span<const_FeeFrac> chunks1;
  Span<const_FeeFrac> chunks1_00;
  Span<const_FeeFrac> chunks1_01;
  Span<const_FeeFrac> chunks1_02;
  Span<const_FeeFrac> chunks1_03;
  Span<const_FeeFrac> chunks1_04;
  Span<const_FeeFrac> chunks1_05;
  Span<const_FeeFrac> chunks1_06;
  Span<const_FeeFrac> chunks1_07;
  Span<const_FeeFrac> chunks1_08;
  Span<const_FeeFrac> chunks1_09;
  Span<const_FeeFrac> chunks1_10;
  Span<const_FeeFrac> chunks1_11;
  Span<const_FeeFrac> chunks1_12;
  Span<const_FeeFrac> chunks1_13;
  Span<const_FeeFrac> chunks1_14;
  Span<const_FeeFrac> chunks1_15;
  Span<const_FeeFrac> chunks1_16;
  Span<const_FeeFrac> chunks1_17;
  Span<const_FeeFrac> chunks1_18;
  Span<const_FeeFrac> chunks0;
  Span<const_FeeFrac> chunks0_00;
  Span<const_FeeFrac> chunks0_01;
  Span<const_FeeFrac> chunks0_02;
  Span<const_FeeFrac> chunks0_03;
  Span<const_FeeFrac> chunks0_04;
  Span<const_FeeFrac> chunks0_05;
  Span<const_FeeFrac> chunks0_06;
  Span<const_FeeFrac> chunks0_07;
  Span<const_FeeFrac> chunks0_08;
  Span<const_FeeFrac> chunks0_09;
  Span<const_FeeFrac> chunks0_10;
  Span<const_FeeFrac> chunks0_11;
  Span<const_FeeFrac> chunks0_12;
  Span<const_FeeFrac> chunks0_13;
  Span<const_FeeFrac> chunks0_14;
  Span<const_FeeFrac> chunks0_15;
  Span<const_FeeFrac> chunks0_16;
  Span<const_FeeFrac> chunks0_17;
  Span<const_FeeFrac> chunks0_18;
  vector<FeeFrac,_std::allocator<FeeFrac>_> new_chunks;
  vector<FeeFrac,_std::allocator<FeeFrac>_> old_chunks;
  check_type cVar4;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  undefined1 *local_460;
  undefined1 *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  assertion_result local_f0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  vector<FeeFrac,_std::allocator<FeeFrac>_> local_b8;
  vector<FeeFrac,_std::allocator<FeeFrac>_> local_a0;
  lazy_ostream local_88;
  undefined1 *local_78;
  char **local_70;
  undefined8 local_68;
  undefined4 local_60;
  undefined8 local_58;
  undefined4 local_50;
  undefined8 local_48;
  undefined4 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88._vptr_lazy_ostream = (_func_int **)0x3b6;
  local_88.m_empty = true;
  local_88._9_3_ = 1;
  local_78 = (undefined1 *)0x64;
  local_70._0_4_ = 100;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_88;
  std::vector<FeeFrac,_std::allocator<FeeFrac>_>::vector(&local_a0,__l,(allocator_type *)&local_b8);
  local_88._vptr_lazy_ostream = (_func_int **)0x3e8;
  local_88._8_4_ = 300;
  local_78 = (undefined1 *)0x32;
  local_70 = (char **)CONCAT44(local_70._4_4_,100);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_88;
  std::vector<FeeFrac,_std::allocator<FeeFrac>_>::vector
            (&local_b8,__l_00,(allocator_type *)&local_f0);
  local_c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_c0 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x22e;
  file.m_begin = (iterator)&local_c8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_d8,msg);
  chunks0.m_size =
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1.m_size =
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1.m_data =
       local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  chunks0.m_data =
       local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  pVar1 = CompareChunks(chunks0,chunks1);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pVar1._M_value == -1);
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_70 = &local_100;
  local_100 = "std::is_lt(CompareChunks(old_chunks, new_chunks))";
  local_f8 = "";
  local_88._8_4_ = local_88._8_4_ & 0xffffff00;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_108 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,&local_88,1,0,WARN,_cVar4,(size_t)&local_110,0x22e);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x22f;
  file_00.m_begin = (iterator)&local_120;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_130,
             msg_00);
  chunks0_00.m_size =
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1_00.m_size =
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1_00.m_data =
       local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  chunks0_00.m_data =
       local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  pVar1 = CompareChunks(chunks0_00,chunks1_00);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pVar1._M_value == '\x01');
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100 = "std::is_gt(CompareChunks(new_chunks, old_chunks))";
  local_f8 = "";
  local_88._8_4_ = local_88._8_4_ & 0xffffff00;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_100;
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_138 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,&local_88,1,0,WARN,_cVar4,(size_t)&local_140,0x22f);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  local_88._vptr_lazy_ostream = (_func_int **)0x3b6;
  local_88.m_empty = true;
  local_88._9_3_ = 1;
  local_78 = (undefined1 *)0x64;
  local_70._0_4_ = 100;
  std::vector<FeeFrac,std::allocator<FeeFrac>>::_M_assign_aux<FeeFrac_const*>
            ((vector<FeeFrac,std::allocator<FeeFrac>> *)&local_a0,&local_88);
  local_88._vptr_lazy_ostream = (_func_int **)0x3e8;
  local_88._8_4_ = 300;
  local_78 = (undefined1 *)0x0;
  local_70 = (char **)CONCAT44(local_70._4_4_,100);
  std::vector<FeeFrac,std::allocator<FeeFrac>>::_M_assign_aux<FeeFrac_const*>
            ((vector<FeeFrac,std::allocator<FeeFrac>> *)&local_b8,&local_88);
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x235;
  file_01.m_begin = (iterator)&local_150;
  msg_01.m_end = pvVar3;
  msg_01.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_160,
             msg_01);
  chunks0_01.m_size =
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1_01.m_size =
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1_01.m_data =
       local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  chunks0_01.m_data =
       local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  pVar1 = CompareChunks(chunks0_01,chunks1_01);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pVar1._M_value == '\x02');
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100 = "CompareChunks(old_chunks, new_chunks) == std::partial_ordering::unordered";
  local_f8 = "";
  local_88._8_4_ = local_88._8_4_ & 0xffffff00;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_100;
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_168 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,&local_88,1,0,WARN,_cVar4,(size_t)&local_170,0x235);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x236;
  file_02.m_begin = (iterator)&local_180;
  msg_02.m_end = pvVar3;
  msg_02.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_190,
             msg_02);
  chunks0_02.m_size =
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1_02.m_size =
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1_02.m_data =
       local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  chunks0_02.m_data =
       local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  pVar1 = CompareChunks(chunks0_02,chunks1_02);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pVar1._M_value == '\x02');
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100 = "CompareChunks(new_chunks, old_chunks) == std::partial_ordering::unordered";
  local_f8 = "";
  local_88._8_4_ = local_88._8_4_ & 0xffffff00;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_100;
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_198 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,&local_88,1,0,WARN,_cVar4,(size_t)&local_1a0,0x236);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  local_88._vptr_lazy_ostream = (_func_int **)0x3b6;
  local_88.m_empty = true;
  local_88._9_3_ = 1;
  local_78 = (undefined1 *)0x64;
  local_70 = (char **)CONCAT44(local_70._4_4_,100);
  std::vector<FeeFrac,std::allocator<FeeFrac>>::_M_assign_aux<FeeFrac_const*>
            ((vector<FeeFrac,std::allocator<FeeFrac>> *)&local_a0,&local_88);
  local_88._vptr_lazy_ostream = (_func_int **)0x44c;
  local_88._8_4_ = 300;
  std::vector<FeeFrac,std::allocator<FeeFrac>>::_M_assign_aux<FeeFrac_const*>
            ((vector<FeeFrac,std::allocator<FeeFrac>> *)&local_b8,&local_88);
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x23c;
  file_03.m_begin = (iterator)&local_1b0;
  msg_03.m_end = pvVar3;
  msg_03.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1c0,
             msg_03);
  chunks0_03.m_size =
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1_03.m_size =
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1_03.m_data =
       local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  chunks0_03.m_data =
       local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  pVar1 = CompareChunks(chunks0_03,chunks1_03);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pVar1._M_value == -1);
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100 = "std::is_lt(CompareChunks(old_chunks, new_chunks))";
  local_f8 = "";
  local_88._8_4_ = local_88._8_4_ & 0xffffff00;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_100;
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_1c8 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,&local_88,1,0,WARN,_cVar4,(size_t)&local_1d0,0x23c);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x23d;
  file_04.m_begin = (iterator)&local_1e0;
  msg_04.m_end = pvVar3;
  msg_04.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1f0,
             msg_04);
  chunks0_04.m_size =
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1_04.m_size =
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1_04.m_data =
       local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  chunks0_04.m_data =
       local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  pVar1 = CompareChunks(chunks0_04,chunks1_04);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pVar1._M_value == '\x01');
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100 = "std::is_gt(CompareChunks(new_chunks, old_chunks))";
  local_f8 = "";
  local_88._8_4_ = local_88._8_4_ & 0xffffff00;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_100;
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_1f8 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,&local_88,1,0,WARN,_cVar4,(size_t)&local_200,0x23d);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  local_88._vptr_lazy_ostream = (_func_int **)0x3b6;
  local_88.m_empty = true;
  local_88._9_3_ = 1;
  local_78 = (undefined1 *)0x64;
  local_70._0_4_ = 100;
  std::vector<FeeFrac,std::allocator<FeeFrac>>::_M_assign_aux<FeeFrac_const*>
            ((vector<FeeFrac,std::allocator<FeeFrac>> *)&local_a0,&local_88);
  local_88._vptr_lazy_ostream = (_func_int **)0x44c;
  local_88._8_4_ = 100;
  local_78 = (undefined1 *)0x0;
  local_70 = (char **)CONCAT44(local_70._4_4_,100);
  std::vector<FeeFrac,std::allocator<FeeFrac>>::_M_assign_aux<FeeFrac_const*>
            ((vector<FeeFrac,std::allocator<FeeFrac>> *)&local_b8,&local_88);
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x244;
  file_05.m_begin = (iterator)&local_210;
  msg_05.m_end = pvVar3;
  msg_05.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_220,
             msg_05);
  chunks0_05.m_size =
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1_05.m_size =
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1_05.m_data =
       local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  chunks0_05.m_data =
       local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  pVar1 = CompareChunks(chunks0_05,chunks1_05);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pVar1._M_value == -1);
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100 = "std::is_lt(CompareChunks(old_chunks, new_chunks))";
  local_f8 = "";
  local_88._8_4_ = local_88._8_4_ & 0xffffff00;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_100;
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_228 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,&local_88,1,0,WARN,_cVar4,(size_t)&local_230,0x244);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x245;
  file_06.m_begin = (iterator)&local_240;
  msg_06.m_end = pvVar3;
  msg_06.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_250,
             msg_06);
  chunks0_06.m_size =
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1_06.m_size =
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1_06.m_data =
       local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  chunks0_06.m_data =
       local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  pVar1 = CompareChunks(chunks0_06,chunks1_06);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pVar1._M_value == '\x01');
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100 = "std::is_gt(CompareChunks(new_chunks, old_chunks))";
  local_f8 = "";
  local_88._8_4_ = local_88._8_4_ & 0xffffff00;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_100;
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_258 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,&local_88,1,0,WARN,_cVar4,(size_t)&local_260,0x245);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  local_88._vptr_lazy_ostream = (_func_int **)0x3b6;
  local_88.m_empty = true;
  local_88._9_3_ = 1;
  local_78 = (undefined1 *)0x64;
  local_70._0_4_ = 100;
  std::vector<FeeFrac,std::allocator<FeeFrac>>::_M_assign_aux<FeeFrac_const*>
            ((vector<FeeFrac,std::allocator<FeeFrac>> *)&local_a0,&local_88);
  local_88._vptr_lazy_ostream = (_func_int **)0x2ee;
  local_88._8_4_ = 100;
  local_78 = (undefined1 *)0xf9;
  local_70 = (char **)CONCAT44(local_70._4_4_,0xfa);
  local_68 = 0x97;
  local_60 = 0x28a;
  std::vector<FeeFrac,std::allocator<FeeFrac>>::_M_assign_aux<FeeFrac_const*>
            ((vector<FeeFrac,std::allocator<FeeFrac>> *)&local_b8,&local_88);
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x24b;
  file_07.m_begin = (iterator)&local_270;
  msg_07.m_end = pvVar3;
  msg_07.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_280,
             msg_07);
  chunks0_07.m_size =
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1_07.m_size =
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1_07.m_data =
       local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  chunks0_07.m_data =
       local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  pVar1 = CompareChunks(chunks0_07,chunks1_07);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pVar1._M_value == '\x02');
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100 = "CompareChunks(old_chunks, new_chunks) == std::partial_ordering::unordered";
  local_f8 = "";
  local_88._8_4_ = local_88._8_4_ & 0xffffff00;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_100;
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_288 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,&local_88,1,0,WARN,_cVar4,(size_t)&local_290,0x24b);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_298 = "";
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x24c;
  file_08.m_begin = (iterator)&local_2a0;
  msg_08.m_end = pvVar3;
  msg_08.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_2b0,
             msg_08);
  chunks0_08.m_size =
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1_08.m_size =
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1_08.m_data =
       local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  chunks0_08.m_data =
       local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  pVar1 = CompareChunks(chunks0_08,chunks1_08);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pVar1._M_value == '\x02');
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100 = "CompareChunks(new_chunks, old_chunks) == std::partial_ordering::unordered";
  local_f8 = "";
  local_88._8_4_ = local_88._8_4_ & 0xffffff00;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_100;
  local_2c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_2b8 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,&local_88,1,0,WARN,_cVar4,(size_t)&local_2c0,0x24c);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  local_88._vptr_lazy_ostream = (_func_int **)0x3b6;
  local_88.m_empty = true;
  local_88._9_3_ = 1;
  local_78 = (undefined1 *)0x64;
  local_70._0_4_ = 100;
  std::vector<FeeFrac,std::allocator<FeeFrac>>::_M_assign_aux<FeeFrac_const*>
            ((vector<FeeFrac,std::allocator<FeeFrac>> *)&local_a0,&local_88);
  local_88._vptr_lazy_ostream = (_func_int **)0x2ee;
  local_88._8_4_ = 100;
  local_78 = (undefined1 *)0xfa;
  local_70 = (char **)CONCAT44(local_70._4_4_,0xfa);
  local_68 = 0x96;
  local_60 = 0x96;
  std::vector<FeeFrac,std::allocator<FeeFrac>>::_M_assign_aux<FeeFrac_const*>
            ((vector<FeeFrac,std::allocator<FeeFrac>> *)&local_b8,&local_88);
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_2c8 = "";
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x252;
  file_09.m_begin = (iterator)&local_2d0;
  msg_09.m_end = pvVar3;
  msg_09.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_2e0,
             msg_09);
  chunks0_09.m_size =
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1_09.m_size =
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1_09.m_data =
       local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  chunks0_09.m_data =
       local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  pVar1 = CompareChunks(chunks0_09,chunks1_09);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pVar1._M_value == -1);
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100 = "std::is_lt(CompareChunks(old_chunks, new_chunks))";
  local_f8 = "";
  local_88._8_4_ = local_88._8_4_ & 0xffffff00;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_100;
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_2e8 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,&local_88,1,0,WARN,_cVar4,(size_t)&local_2f0,0x252);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_2f8 = "";
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x253;
  file_10.m_begin = (iterator)&local_300;
  msg_10.m_end = pvVar3;
  msg_10.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_310,
             msg_10);
  chunks0_10.m_size =
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1_10.m_size =
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1_10.m_data =
       local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  chunks0_10.m_data =
       local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  pVar1 = CompareChunks(chunks0_10,chunks1_10);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pVar1._M_value == '\x01');
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100 = "std::is_gt(CompareChunks(new_chunks, old_chunks))";
  local_f8 = "";
  local_88._8_4_ = local_88._8_4_ & 0xffffff00;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_100;
  local_320 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_318 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,&local_88,1,0,WARN,_cVar4,(size_t)&local_320,0x253);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  local_88._vptr_lazy_ostream = (_func_int **)0x3b6;
  local_88.m_empty = true;
  local_88._9_3_ = 1;
  local_78 = (undefined1 *)0x64;
  local_70._0_4_ = 100;
  std::vector<FeeFrac,std::allocator<FeeFrac>>::_M_assign_aux<FeeFrac_const*>
            ((vector<FeeFrac,std::allocator<FeeFrac>> *)&local_a0,&local_88);
  local_88._vptr_lazy_ostream = (_func_int **)0x3b6;
  local_88._8_4_ = 300;
  local_78 = (undefined1 *)0x64;
  local_70 = (char **)CONCAT44(local_70._4_4_,100);
  std::vector<FeeFrac,std::allocator<FeeFrac>>::_M_assign_aux<FeeFrac_const*>
            ((vector<FeeFrac,std::allocator<FeeFrac>> *)&local_b8,&local_88);
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_328 = "";
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x259;
  file_11.m_begin = (iterator)&local_330;
  msg_11.m_end = pvVar3;
  msg_11.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_340,
             msg_11);
  chunks0_11.m_size =
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1_11.m_size =
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1_11.m_data =
       local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  chunks0_11.m_data =
       local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  pVar1 = CompareChunks(chunks0_11,chunks1_11);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pVar1._M_value == '\0');
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100 = "std::is_eq(CompareChunks(old_chunks, new_chunks))";
  local_f8 = "";
  local_88._8_4_ = local_88._8_4_ & 0xffffff00;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_100;
  local_350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_348 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,&local_88,1,0,WARN,_cVar4,(size_t)&local_350,0x259);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_358 = "";
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x25a;
  file_12.m_begin = (iterator)&local_360;
  msg_12.m_end = pvVar3;
  msg_12.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_370,
             msg_12);
  chunks0_12.m_size =
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1_12.m_size =
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1_12.m_data =
       local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  chunks0_12.m_data =
       local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  pVar1 = CompareChunks(chunks0_12,chunks1_12);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pVar1._M_value == '\0');
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100 = "std::is_eq(CompareChunks(new_chunks, old_chunks))";
  local_f8 = "";
  local_88._8_4_ = local_88._8_4_ & 0xffffff00;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_100;
  local_380 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_378 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,&local_88,1,0,WARN,_cVar4,(size_t)&local_380,0x25a);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  local_88._vptr_lazy_ostream = (_func_int **)0x3b6;
  local_88.m_empty = true;
  local_88._9_3_ = 1;
  local_78 = (undefined1 *)0x64;
  local_70._0_4_ = 99;
  std::vector<FeeFrac,std::allocator<FeeFrac>>::_M_assign_aux<FeeFrac_const*>
            ((vector<FeeFrac,std::allocator<FeeFrac>> *)&local_a0,&local_88);
  local_88._vptr_lazy_ostream = (_func_int **)0x3b6;
  local_88._8_4_ = 300;
  local_78 = (undefined1 *)0x64;
  local_70 = (char **)CONCAT44(local_70._4_4_,100);
  std::vector<FeeFrac,std::allocator<FeeFrac>>::_M_assign_aux<FeeFrac_const*>
            ((vector<FeeFrac,std::allocator<FeeFrac>> *)&local_b8,&local_88);
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_388 = "";
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x261;
  file_13.m_begin = (iterator)&local_390;
  msg_13.m_end = pvVar3;
  msg_13.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_3a0,
             msg_13);
  chunks0_13.m_size =
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1_13.m_size =
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1_13.m_data =
       local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  chunks0_13.m_data =
       local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  pVar1 = CompareChunks(chunks0_13,chunks1_13);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pVar1._M_value == '\x01');
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100 = "std::is_gt(CompareChunks(old_chunks, new_chunks))";
  local_f8 = "";
  local_88._8_4_ = local_88._8_4_ & 0xffffff00;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_100;
  local_3b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_3a8 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,&local_88,1,0,WARN,_cVar4,(size_t)&local_3b0,0x261);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_3b8 = "";
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x262;
  file_14.m_begin = (iterator)&local_3c0;
  msg_14.m_end = pvVar3;
  msg_14.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_3d0,
             msg_14);
  chunks0_14.m_size =
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1_14.m_size =
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1_14.m_data =
       local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  chunks0_14.m_data =
       local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  pVar1 = CompareChunks(chunks0_14,chunks1_14);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pVar1._M_value == -1);
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100 = "std::is_lt(CompareChunks(new_chunks, old_chunks))";
  local_f8 = "";
  local_88._8_4_ = local_88._8_4_ & 0xffffff00;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_100;
  local_3e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_3d8 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,&local_88,1,0,WARN,_cVar4,(size_t)&local_3e0,0x262);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  local_88._vptr_lazy_ostream = (_func_int **)0x3b6;
  local_88.m_empty = true;
  local_88._9_3_ = 1;
  local_78 = (undefined1 *)0x64;
  local_70._0_4_ = 99;
  std::vector<FeeFrac,std::allocator<FeeFrac>>::_M_assign_aux<FeeFrac_const*>
            ((vector<FeeFrac,std::allocator<FeeFrac>> *)&local_a0,&local_88);
  local_88._vptr_lazy_ostream = (_func_int **)0x3b6;
  local_88._8_4_ = 300;
  local_78 = (undefined1 *)0x64;
  local_70 = (char **)CONCAT44(local_70._4_4_,100);
  local_68 = 0;
  local_60 = 1;
  local_58 = 0;
  local_50 = 1;
  std::vector<FeeFrac,std::allocator<FeeFrac>>::_M_assign_aux<FeeFrac_const*>
            ((vector<FeeFrac,std::allocator<FeeFrac>> *)&local_b8,&local_88);
  local_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_3e8 = "";
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x268;
  file_15.m_begin = (iterator)&local_3f0;
  msg_15.m_end = pvVar3;
  msg_15.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_400,
             msg_15);
  chunks0_15.m_size =
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1_15.m_size =
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1_15.m_data =
       local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  chunks0_15.m_data =
       local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  pVar1 = CompareChunks(chunks0_15,chunks1_15);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pVar1._M_value == '\x01');
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100 = "std::is_gt(CompareChunks(old_chunks, new_chunks))";
  local_f8 = "";
  local_88._8_4_ = local_88._8_4_ & 0xffffff00;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_100;
  local_410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_408 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,&local_88,1,0,WARN,_cVar4,(size_t)&local_410,0x268);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_418 = "";
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x269;
  file_16.m_begin = (iterator)&local_420;
  msg_16.m_end = pvVar3;
  msg_16.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_430,
             msg_16);
  chunks0_16.m_size =
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1_16.m_size =
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1_16.m_data =
       local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  chunks0_16.m_data =
       local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  pVar1 = CompareChunks(chunks0_16,chunks1_16);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pVar1._M_value == -1);
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100 = "std::is_lt(CompareChunks(new_chunks, old_chunks))";
  local_f8 = "";
  local_88._8_4_ = local_88._8_4_ & 0xffffff00;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_100;
  local_440 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_438 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,&local_88,1,0,WARN,_cVar4,(size_t)&local_440,0x269);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  local_88._vptr_lazy_ostream = (_func_int **)0x3b6;
  local_88._8_4_ = 300;
  local_78 = (undefined1 *)0x64;
  local_70 = (char **)CONCAT44(local_70._4_4_,100);
  local_68 = 0;
  local_60 = 1;
  local_58 = 0;
  local_50 = 1;
  local_48 = 1;
  local_40 = 1;
  std::vector<FeeFrac,std::allocator<FeeFrac>>::_M_assign_aux<FeeFrac_const*>
            ((vector<FeeFrac,std::allocator<FeeFrac>> *)&local_b8,&local_88);
  local_450 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_448 = "";
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x26d;
  file_17.m_begin = (iterator)&local_450;
  msg_17.m_end = pvVar3;
  msg_17.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_460,
             msg_17);
  chunks0_17.m_size =
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1_17.m_size =
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1_17.m_data =
       local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  chunks0_17.m_data =
       local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  pVar1 = CompareChunks(chunks0_17,chunks1_17);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pVar1._M_value == '\x02');
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100 = "CompareChunks(old_chunks, new_chunks) == std::partial_ordering::unordered";
  local_f8 = "";
  local_88._8_4_ = local_88._8_4_ & 0xffffff00;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_100;
  local_470 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_468 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,&local_88,1,0,WARN,_cVar4,(size_t)&local_470,0x26d);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  local_480 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp";
  local_478 = "";
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x26e;
  file_18.m_begin = (iterator)&local_480;
  msg_18.m_end = pvVar3;
  msg_18.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_490,
             msg_18);
  chunks0_18.m_size =
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1_18.m_size =
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  chunks1_18.m_data =
       local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  chunks0_18.m_data =
       local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
       super__Vector_impl_data._M_start;
  pVar1 = CompareChunks(chunks0_18,chunks1_18);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pVar1._M_value == '\x02');
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100 = "CompareChunks(new_chunks, old_chunks) == std::partial_ordering::unordered";
  local_f8 = "";
  local_88._8_4_ = local_88._8_4_ & 0xffffff00;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_100;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,&local_88,1,0,WARN,0xec2eb4,(size_t)&stack0xfffffffffffffb60,0x26e);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  if (local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.super__Vector_impl_data
      ._M_start != (FeeFrac *)0x0) {
    operator_delete(local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.super__Vector_impl_data
      ._M_start != (FeeFrac *)0x0) {
    operator_delete(local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(feerate_chunks_utilities)
{
    // Sanity check the correctness of the feerate chunks comparison.

    // A strictly better case.
    std::vector<FeeFrac> old_chunks{{{950, 300}, {100, 100}}};
    std::vector<FeeFrac> new_chunks{{{1000, 300}, {50, 100}}};

    BOOST_CHECK(std::is_lt(CompareChunks(old_chunks, new_chunks)));
    BOOST_CHECK(std::is_gt(CompareChunks(new_chunks, old_chunks)));

    // Incomparable diagrams
    old_chunks = {{950, 300}, {100, 100}};
    new_chunks = {{1000, 300}, {0, 100}};

    BOOST_CHECK(CompareChunks(old_chunks, new_chunks) == std::partial_ordering::unordered);
    BOOST_CHECK(CompareChunks(new_chunks, old_chunks) == std::partial_ordering::unordered);

    // Strictly better but smaller size.
    old_chunks = {{950, 300}, {100, 100}};
    new_chunks = {{1100, 300}};

    BOOST_CHECK(std::is_lt(CompareChunks(old_chunks, new_chunks)));
    BOOST_CHECK(std::is_gt(CompareChunks(new_chunks, old_chunks)));

    // New diagram is strictly better due to the first chunk, even though
    // second chunk contributes no fees
    old_chunks = {{950, 300}, {100, 100}};
    new_chunks = {{1100, 100}, {0, 100}};

    BOOST_CHECK(std::is_lt(CompareChunks(old_chunks, new_chunks)));
    BOOST_CHECK(std::is_gt(CompareChunks(new_chunks, old_chunks)));

    // Feerate of first new chunk is better with, but second chunk is worse
    old_chunks = {{950, 300}, {100, 100}};
    new_chunks = {{750, 100}, {249, 250}, {151, 650}};

    BOOST_CHECK(CompareChunks(old_chunks, new_chunks) == std::partial_ordering::unordered);
    BOOST_CHECK(CompareChunks(new_chunks, old_chunks) == std::partial_ordering::unordered);

    // If we make the second chunk slightly better, the new diagram now wins.
    old_chunks = {{950, 300}, {100, 100}};
    new_chunks = {{750, 100}, {250, 250}, {150, 150}};

    BOOST_CHECK(std::is_lt(CompareChunks(old_chunks, new_chunks)));
    BOOST_CHECK(std::is_gt(CompareChunks(new_chunks, old_chunks)));

    // Identical diagrams, cannot be strictly better
    old_chunks = {{950, 300}, {100, 100}};
    new_chunks = {{950, 300}, {100, 100}};

    BOOST_CHECK(std::is_eq(CompareChunks(old_chunks, new_chunks)));
    BOOST_CHECK(std::is_eq(CompareChunks(new_chunks, old_chunks)));

    // Same aggregate fee, but different total size (trigger single tail fee check step)
    old_chunks = {{950, 300}, {100, 99}};
    new_chunks = {{950, 300}, {100, 100}};

    // No change in evaluation when tail check needed.
    BOOST_CHECK(std::is_gt(CompareChunks(old_chunks, new_chunks)));
    BOOST_CHECK(std::is_lt(CompareChunks(new_chunks, old_chunks)));

    // Trigger multiple tail fee check steps
    old_chunks = {{950, 300}, {100, 99}};
    new_chunks = {{950, 300}, {100, 100}, {0, 1}, {0, 1}};

    BOOST_CHECK(std::is_gt(CompareChunks(old_chunks, new_chunks)));
    BOOST_CHECK(std::is_lt(CompareChunks(new_chunks, old_chunks)));

    // Multiple tail fee check steps, unordered result
    new_chunks = {{950, 300}, {100, 100}, {0, 1}, {0, 1}, {1, 1}};
    BOOST_CHECK(CompareChunks(old_chunks, new_chunks) == std::partial_ordering::unordered);
    BOOST_CHECK(CompareChunks(new_chunks, old_chunks) == std::partial_ordering::unordered);
}